

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int max_output_for_action(char *action,int cur_max)

{
  action_value aVar1;
  int iVar2;
  int in_ESI;
  char *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_ESI == -1) {
    local_4 = -1;
  }
  else {
    aVar1 = action_type((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    local_4 = in_ESI;
    if ((Action_Bridge < aVar1) && (aVar1 != Action_Terminal)) {
      if (aVar1 - Action_Filter < 2) {
        iVar2 = strncmp(in_RDI,"Router Action",0xd);
        if (iVar2 == 0) {
          local_4 = -1;
        }
        else {
          local_4 = in_ESI;
          if (in_ESI < 1) {
            local_4 = 1;
          }
        }
      }
      else {
        if (((aVar1 != Action_Multi) && (aVar1 != Action_Split)) && (aVar1 != Action_Source)) {
          printf("Didn\'t expect case in max_output_for_action\n");
          exit(1);
        }
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

static int
max_output_for_action(char *action, int cur_max)
{
    if (cur_max == -1) return -1;
    switch (action_type(action)) {
    case Action_NoAction:
    case Action_Terminal:
    case Action_Bridge:
	return cur_max;
    case Action_Filter:
    case Action_Immediate:
	if (strncmp(action, "Router Action", 13) == 0) {
	    /* router spec, could be lots */
	    return -1;
	}
	if (cur_max < 1) {
	    return 1;
	} else {
	    return cur_max;
	}
    case Action_Multi:
    case Action_Split:
    case Action_Source:
	return -1; /* no max */
    default:
	printf("Didn't expect case in max_output_for_action\n");
	exit(1);
    }
}